

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

void R_SetDefaultColormap(char *name)

{
  BYTE *pBVar1;
  int iVar2;
  FakeCmap *pFVar3;
  BYTE *map2;
  FWadLump lumpr;
  FDynamicColormap foo;
  BYTE remap [256];
  BYTE unremap [256];
  BYTE map [256];
  int local_1c;
  int local_18;
  int j;
  int i;
  int lump;
  char *name_local;
  
  pFVar3 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,0);
  iVar2 = strncasecmp(pFVar3->name,name,8);
  if (iVar2 != 0) {
    j = FWadCollection::CheckNumForFullName(&Wads,name,true,3);
    if (j == -1) {
      j = FWadCollection::CheckNumForName(&Wads,name,0);
    }
    if (((j == -1) ||
        (iVar2 = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0), -1 < iVar2)) ||
       (iVar2 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0), -1 < iVar2)) {
      Printf("Make colormap\n");
      FDynamicColormap::FDynamicColormap((FDynamicColormap *)&lumpr.Lump);
      PalEntry::operator=((PalEntry *)&foo,0xffffff);
      PalEntry::operator=((PalEntry *)((long)&foo.Maps + 4),0);
      lumpr.Lump = (FResourceLump *)realcolormaps;
      foo.Color.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
      foo.Desaturate = 0;
      foo._20_4_ = 0;
      FDynamicColormap::BuildLights((FDynamicColormap *)&lumpr.Lump);
    }
    else {
      FWadCollection::OpenLumpNum((FWadLump *)&map2,&Wads,j);
      memcpy(&foo.Next,GPalette.Remap,0x100);
      memset(remap + 0xf8,0,0x100);
      for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
        remap[(ulong)remap[(long)local_18 + -8] + 0xf8] = (BYTE)local_18;
      }
      foo.Next._0_1_ = 0;
      for (local_18 = 0; pBVar1 = realcolormaps, local_18 < 0x20; local_18 = local_18 + 1) {
        FWadLump::Read((FWadLump *)&map2,unremap + 0xf8,0x100);
        for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
          pBVar1[(long)local_1c + (long)(local_18 << 8)] =
               remap[(ulong)unremap[(ulong)remap[(long)local_1c + 0xf8] + 0xf8] - 8];
        }
      }
      FWadLump::~FWadLump((FWadLump *)&map2);
    }
    pFVar3 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,0);
    uppercopy(pFVar3->name,name);
    pFVar3 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,0);
    PalEntry::operator=(&pFVar3->blend,0);
    return;
  }
  return;
}

Assistant:

void R_SetDefaultColormap (const char *name)
{
	if (strnicmp (fakecmaps[0].name, name, 8) != 0)
	{
		int lump, i, j;
		BYTE map[256];
		BYTE unremap[256];
		BYTE remap[256];

		lump = Wads.CheckNumForFullName (name, true, ns_colormaps);
		if (lump == -1)
			lump = Wads.CheckNumForName (name, ns_global);

		// [RH] If using BUILD's palette, generate the colormap
		if (lump == -1 || Wads.CheckNumForFullName("palette.dat") >= 0 || Wads.CheckNumForFullName("blood.pal") >= 0)
		{
			Printf ("Make colormap\n");
			FDynamicColormap foo;

			foo.Color = 0xFFFFFF;
			foo.Fade = 0;
			foo.Maps = realcolormaps;
			foo.Desaturate = 0;
			foo.Next = NULL;
			foo.BuildLights ();
		}
		else
		{
			FWadLump lumpr = Wads.OpenLumpNum (lump);

			// [RH] The colormap may not have been designed for the specific
			// palette we are using, so remap it to match the current palette.
			memcpy (remap, GPalette.Remap, 256);
			memset (unremap, 0, 256);
			for (i = 0; i < 256; ++i)
			{
				unremap[remap[i]] = i;
			}
			// Mapping to color 0 is okay, because the colormap won't be used to
			// produce a masked texture.
			remap[0] = 0;
			for (i = 0; i < NUMCOLORMAPS; ++i)
			{
				BYTE *map2 = &realcolormaps[i*256];
				lumpr.Read (map, 256);
				for (j = 0; j < 256; ++j)
				{
					map2[j] = remap[map[unremap[j]]];
				}
			}
		}

		uppercopy (fakecmaps[0].name, name);
		fakecmaps[0].blend = 0;
	}
}